

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cp.cpp
# Opt level: O1

bool __thiscall CmdCp::CopyDirectory(CmdCp *this,string *fileFrom,string *fileTo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  FileType FVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  _List_node_base *p_Var7;
  string *psVar8;
  _Alloc_hider _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nextFileTo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nextFileFrom;
  __string_type __str_1;
  StrList l;
  string local_130;
  string local_110;
  undefined1 *local_f0;
  ulong local_e8;
  undefined1 local_e0 [16];
  CmdCp *local_d0;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_d0 = this;
  DirUtils::GetDirFiles((StrList *)&local_48,fileFrom);
  if (local_48._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
    paVar1 = &local_130.field_2;
    p_Var7 = local_48._M_impl._M_node.super__List_node_base._M_next;
    do {
      pcVar2 = (fileFrom->_M_dataplus)._M_p;
      local_130._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar2,pcVar2 + fileFrom->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_130,local_130._M_string_length,0,'\x01');
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)p_Var7[1]._M_next);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_110.field_2._M_allocated_capacity = *psVar6;
        local_110.field_2._8_8_ = plVar5[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar6;
        local_110._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_110._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      local_f0 = local_e0;
      pcVar2 = (fileTo->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar2,pcVar2 + fileTo->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_f0,local_e8,0,'\x01');
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)p_Var7[1]._M_next);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_130.field_2._M_allocated_capacity = *psVar6;
        local_130.field_2._8_8_ = plVar5[3];
        local_130._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar6;
        local_130._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_130._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_f0 != local_e0) {
        operator_delete(local_f0);
      }
      FVar3 = DirUtils::GetFileType(&local_110);
      if (FVar3 == DU_FILE) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_110._M_dataplus._M_p,
                   local_110._M_dataplus._M_p + local_110._M_string_length);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        psVar8 = &local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,local_130._M_dataplus._M_p,
                   local_130._M_dataplus._M_p + local_130._M_string_length);
        CopyFile((CmdCp *)psVar8,&local_a8,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        psVar8 = &local_a8;
        _Var9._M_p = local_a8._M_dataplus._M_p;
LAB_00109d87:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &psVar8->field_2) {
          operator_delete(_Var9._M_p);
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)(p_Var7 + 1));
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare((char *)(p_Var7 + 1));
          if (iVar4 != 0) {
            DirUtils::MakeDirectory(&local_130);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,local_110._M_dataplus._M_p,
                       local_110._M_dataplus._M_p + local_110._M_string_length);
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,local_130._M_dataplus._M_p,
                       local_130._M_dataplus._M_p + local_130._M_string_length);
            CopyDirectory(local_d0,&local_c8,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p);
            }
            psVar8 = &local_c8;
            _Var9._M_p = local_c8._M_dataplus._M_p;
            goto LAB_00109d87;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      p_Var7 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var7 != (_List_node_base *)&local_48);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_48);
  return true;
}

Assistant:

bool CmdCp::CopyDirectory(string fileFrom, string fileTo){
	auto l = GetDirFiles(fileFrom);
	for(auto i = l.begin(); i != l.end(); i++){
		auto nextFileFrom = fileFrom + '/' + *i;
		auto nextFileTo = fileTo + '/' + *i;
		if(GetFileType(nextFileFrom) == DU_FILE){
			CopyFile(nextFileFrom, nextFileTo);
		}
		else{	/* recursion */
			if(*i == "." || *i == "..")continue;
			else{
				MakeDirectory(nextFileTo);
				CopyDirectory(nextFileFrom, nextFileTo);
			}
		}
	}
	return true;
}